

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v2.cpp
# Opt level: O2

void __thiscall intel_keym_v2_t::km_hash_t::~km_hash_t(km_hash_t *this)

{
  ~km_hash_t(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

intel_keym_v2_t::km_hash_t::~km_hash_t() {
    _clean_up();
}